

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_grad_fe.h
# Opt level: O0

vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
lf::fe::MeshFunctionGradFE<double,_double>::operator()
          (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *__return_storage_ptr__,MeshFunctionGradFE<double,_double> *this,Entity *e,
          MatrixXd *local)

{
  Index *this_00;
  double dVar1;
  ulong uVar2;
  int iVar3;
  dim_t from;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Index IVar5;
  reference peVar6;
  CoeffReturnType pdVar7;
  Scalar *pSVar8;
  undefined4 extraout_var_01;
  size_type sVar9;
  long startCol;
  Index IVar10;
  Matrix<double,_1,1,0,_1,1> *this_01;
  undefined1 auVar11 [16];
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar12;
  Type local_1f0;
  TransposeReturnType local_1b8;
  Type local_180;
  Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>,_0>
  local_148;
  ulong local_d8;
  Index i_1;
  long local_c8;
  long dim_local;
  MatrixXd jac_t;
  undefined1 local_98 [8];
  Matrix<double,_1,__1,_1,_1,__1> local_grads;
  Index i;
  span<const_long,_18446744073709551615UL> global_dofs;
  Index local_60;
  int local_54;
  undefined1 local_50 [8];
  Matrix<double,_1,__1,_1,_1,__1> local_dofs;
  Matrix<double,__1,__1,_0,__1,__1> grad_sf_eval;
  MatrixXd *local_local;
  Entity *e_local;
  MeshFunctionGradFE<double,_double> *this_local;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *result;
  
  peVar4 = std::
           __shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar3 = (*peVar4->_vptr_ScalarFESpace[2])(peVar4,e);
  this_00 = &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_cols;
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x40))
            (this_00,(long *)CONCAT44(extraout_var,iVar3),local);
  local_54 = 1;
  local_60 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00);
  Eigen::Matrix<double,1,-1,1,1,-1>::Matrix<int,long>
            ((Matrix<double,1,_1,1,1,_1> *)local_50,&local_54,&local_60);
  peVar4 = std::
           __shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar3 = (*peVar4->_vptr_ScalarFESpace[1])();
  auVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x28))
                      ((long *)CONCAT44(extraout_var_00,iVar3),e);
  for (local_grads.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
            0; IVar10 = local_grads.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_cols, global_dofs._M_ptr = auVar11._8_8_, i = auVar11._0_8_,
      IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols), IVar10 < IVar5;
      local_grads.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
           local_grads.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
           m_cols + 1) {
    peVar6 = std::span<const_long,_18446744073709551615UL>::operator[]
                       ((span<const_long,_18446744073709551615UL> *)&i,
                        local_grads.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_cols);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->dof_vector_,*peVar6);
    dVar1 = *pdVar7;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_50,
                        local_grads.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_cols);
    auVar11._8_8_ = global_dofs._M_ptr;
    auVar11._0_8_ = i;
    *pSVar8 = dVar1;
  }
  PVar12 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)local_50,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                      &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_cols);
  jac_t.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)PVar12.m_lhs;
  Eigen::
  DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
  ::eval((DenseBase<Eigen::Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
          *)local_98);
  iVar3 = (*e->_vptr_Entity[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x28))
            (&dim_local,(long *)CONCAT44(extraout_var_01,iVar3),local);
  iVar3 = (*e->_vptr_Entity[4])();
  i_1._7_1_ = (undefined1)iVar3;
  from = lf::base::RefEl::Dimension((RefEl *)((long)&i_1 + 7));
  local_c8 = lf::base::narrow<long,unsigned_int>(from);
  i_1._6_1_ = 0;
  sVar9 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)((long)&i_1 + 5));
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector(__return_storage_ptr__,sVar9,
           (allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)((long)&i_1 + 5));
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)((long)&i_1 + 5));
  for (local_d8 = 0; uVar2 = local_d8,
      sVar9 = std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::size(__return_storage_ptr__), uVar2 < sVar9; local_d8 = local_d8 + 1) {
    startCol = local_c8 * local_d8;
    IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&dim_local);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
              (&local_180,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&dim_local,0,startCol,
               IVar10,local_c8);
    Eigen::DenseBase<Eigen::Matrix<double,1,-1,1,1,-1>>::block<int,long>
              (&local_1f0,(DenseBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)local_98,0,
               local_d8 * local_c8,1,local_c8);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>_>::
    transpose(&local_1b8,
              (DenseBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_> *)
              &local_1f0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::operator*
              (&local_148,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
               &local_180,
               (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>
                *)&local_1b8);
    this_01 = (Matrix<double,_1,1,0,_1,1> *)
              std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](__return_storage_ptr__,local_d8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (this_01,(DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>,_0>_>
                        *)&local_148);
  }
  i_1._6_1_ = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&dim_local)
  ;
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_98);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<Scalar, Eigen::Dynamic, 1>> operator()(
      const lf::mesh::Entity& e, const Eigen::MatrixXd& local) const {
    // Access information on local shape functions for the entity
    auto grad_sf_eval =
        fe_space_->ShapeFunctionLayout(e)->GradientsReferenceShapeFunctions(
            local);
    // Fetch the coefficients of the global shape functions associated with
    // the current mesh entity
    Eigen::Matrix<SCALAR_COEFF, 1, Eigen::Dynamic> local_dofs(
        1, grad_sf_eval.rows());
    auto global_dofs = fe_space_->LocGlobMap().GlobalDofIndices(e);
    for (Eigen::Index i = 0; i < grad_sf_eval.rows(); ++i) {
      local_dofs(i) = dof_vector_(global_dofs[i]);
    }
    // gradients w.r.t. reference element coordinates \hat{x}
    auto local_grads = (local_dofs * grad_sf_eval).eval();
    // Transform to Cartesian coordinates
    auto jac_t = e.Geometry()->JacobianInverseGramian(local);
    auto dim_local = base::narrow<Eigen::Index>(e.RefEl().Dimension());
    std::vector<Eigen::Matrix<Scalar, Eigen::Dynamic, 1>> result(local.cols());
    // Transform all the local gradients in the evaluation points
    for (Eigen::Index i = 0; i < result.size(); ++i) {
      result[i] = jac_t.block(0, dim_local * i, jac_t.rows(), dim_local) *
                  local_grads.block(0, i * dim_local, 1, dim_local).transpose();
    }
    return result;
  }